

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O1

void warning(WarningID id,char *fmt,...)

{
  code *pcVar1;
  char in_AL;
  WarningState WVar2;
  undefined8 in_RCX;
  char *flagfmt;
  WarningState WVar3;
  undefined8 in_RDX;
  char *type;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_d8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_d8.reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &args[0].overflow_arg_area;
  local_d8.gp_offset = 0x10;
  local_d8.fp_offset = 0x30;
  WVar2 = WARNING_DISABLED;
  if (warnings) {
    WVar3 = warningStates[id];
    if (WVar3 == WARNING_DEFAULT) {
      WVar3 = defaultWarnings[id];
    }
    WVar2 = WARNING_ERROR;
    if (WVar3 != WARNING_ENABLED) {
      WVar2 = WVar3;
    }
    if (!warningsAreErrors) {
      WVar2 = WVar3;
    }
  }
  if (WVar2 != WARNING_DISABLED) {
    local_a8 = in_RDX;
    local_a0 = in_RCX;
    local_98 = in_R8;
    local_90 = in_R9;
    if (WVar2 == WARNING_ERROR) {
      type = "error: ";
      flagfmt = ": [-Werror=%s]\n    ";
    }
    else {
      if (WVar2 == WARNING_DEFAULT) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      type = "warning: ";
      flagfmt = ": [-W%s]\n    ";
    }
    printDiag(fmt,&local_d8,type,flagfmt,warningFlags[id]);
  }
  return;
}

Assistant:

void warning(enum WarningID id, char const *fmt, ...)
{
	char const *flag = warningFlags[id];
	va_list args;

	va_start(args, fmt);

	switch (warningState(id)) {
	case WARNING_DISABLED:
		return;

	case WARNING_ERROR:
		printDiag(fmt, args, "error: ", ": [-Werror=%s]\n    ", flag);
		va_end(args);
		return;

	case WARNING_DEFAULT:
		unreachable_();
		// Not reached

	case WARNING_ENABLED:
		break;
	}

	printDiag(fmt, args, "warning: ", ": [-W%s]\n    ", flag);

	va_end(args);
}